

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::GetTempDirectories
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *list)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *__s;
  int iVar1;
  reference pvVar2;
  long lVar3;
  undefined1 local_108 [8];
  stat statbuf;
  string dstr;
  char *candidates [4];
  
  std::__debug::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(list);
  getenv("TEST_TMPDIR");
  getenv("TMPDIR");
  getenv("TMP");
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (statbuf.__glibc_reserved + 2);
  lVar3 = 0;
  do {
    if (lVar3 == 4) {
      return;
    }
    __s = candidates[lVar3 + -1];
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)this,__s,(allocator<char> *)local_108);
      pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](this,(size_type)(dstr._M_dataplus._M_p + -1));
      if (*pvVar2 != '/') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this,"/");
      }
      std::__debug::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(list,this);
      iVar1 = stat(__s,(stat *)local_108);
      if ((iVar1 == 0) && (((uint)statbuf.st_nlink & 0xf000) == 0x4000)) {
        std::__cxx11::string::~string((string *)(statbuf.__glibc_reserved + 2));
        return;
      }
      std::__cxx11::string::~string((string *)this);
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static void GetTempDirectories(vector<string>* list) {
  list->clear();
#ifdef GLOG_OS_WINDOWS
  // On windows we'll try to find a directory in this order:
  //   C:/Documents & Settings/whomever/TEMP (or whatever GetTempPath() is)
  //   C:/TMP/
  //   C:/TEMP/
  //   C:/WINDOWS/ or C:/WINNT/
  //   .
  char tmp[MAX_PATH];
  if (GetTempPathA(MAX_PATH, tmp))
    list->push_back(tmp);
  list->push_back("C:\\tmp\\");
  list->push_back("C:\\temp\\");
#else
  // Directories, in order of preference. If we find a dir that
  // exists, we stop adding other less-preferred dirs
  const char * candidates[] = {
    // Non-null only during unittest/regtest
    getenv("TEST_TMPDIR"),

    // Explicitly-supplied temp dirs
    getenv("TMPDIR"), getenv("TMP"),

    // If all else fails
    "/tmp",
  };

  for (size_t i = 0; i < ARRAYSIZE(candidates); i++) {
    const char *d = candidates[i];
    if (!d) continue;  // Empty env var

    // Make sure we don't surprise anyone who's expecting a '/'
    string dstr = d;
    if (dstr[dstr.size() - 1] != '/') {
      dstr += "/";
    }
    list->push_back(dstr);

    struct stat statbuf;
    if (!stat(d, &statbuf) && S_ISDIR(statbuf.st_mode)) {
      // We found a dir that exists - we're done.
      return;
    }
  }

#endif
}